

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O1

bool test_Player_fortify(bool verbose)

{
  int iVar1;
  int iVar2;
  pointer ppPVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar4;
  pointer ppCVar5;
  vector<Map::Country*,std::allocator<Map::Country*>> *this;
  iterator __position;
  pointer pcVar6;
  int iVar7;
  GameLoop *pGVar8;
  Country *pCVar9;
  ostream *poVar10;
  Country *neighbour;
  Country *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  int local_54;
  string local_50;
  
  GameLoop::start();
  pGVar8 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar8);
  pGVar8 = GameLoop::getInstance();
  ppPVar3 = (pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppPVar3) {
    pvVar4 = (*ppPVar3)->pOwnedCountries;
    ppCVar5 = (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppCVar5) {
      iVar1 = *(*ppCVar5)->pNumberOfTroops;
      pCVar9 = (Country *)operator_new(0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"neighbour","");
      Map::Country::Country(pCVar9,99,&local_50,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_80 = pCVar9;
      pGVar8 = GameLoop::getInstance();
      ppPVar3 = (pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppPVar3) {
        *pCVar9->pPlayerOwnerId = *(*ppPVar3)->pPlayerId;
        iVar2 = *local_80->pNumberOfTroops;
        pGVar8 = GameLoop::getInstance();
        ppPVar3 = (pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppPVar3) {
          pvVar4 = (*ppPVar3)->pOwnedCountries;
          ppCVar5 = (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish != ppCVar5) {
            this = (vector<Map::Country*,std::allocator<Map::Country*>> *)(*ppCVar5)->pAdjCountries;
            __position._M_current = *(Country ***)(this + 8);
            if (__position._M_current == *(Country ***)(this + 0x10)) {
              std::vector<Map::Country*,std::allocator<Map::Country*>>::
              _M_realloc_insert<Map::Country*const&>(this,__position,&local_80);
            }
            else {
              *__position._M_current = local_80;
              *(long *)(this + 8) = *(long *)(this + 8) + 8;
            }
            pGVar8 = GameLoop::getInstance();
            ppPVar3 = (pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                _M_impl.super__Vector_impl_data._M_finish != ppPVar3) {
              iVar7 = Player::fortify(*ppPVar3);
              if (!verbose) {
LAB_00109d85:
                GameLoop::resetInstance();
                return iVar7 != -1;
              }
              pGVar8 = GameLoop::getInstance();
              ppPVar3 = (pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((pGVar8->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish != ppPVar3) {
                pvVar4 = (*ppPVar3)->pOwnedCountries;
                ppCVar5 = (pvVar4->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                local_54 = iVar7;
                if ((pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish != ppCVar5) {
                  pCVar9 = *ppCVar5;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\x1b[35m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Country ",8);
                  pcVar6 = (pCVar9->cyName->_M_dataplus)._M_p;
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_78,pcVar6,pcVar6 + pCVar9->cyName->_M_string_length);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_78,local_70);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," had ",5);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," armies",7);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  if (local_78 != local_68) {
                    operator_delete(local_78,local_68[0] + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Country ",8);
                  pcVar6 = (pCVar9->cyName->_M_dataplus)._M_p;
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_78,pcVar6,pcVar6 + pCVar9->cyName->_M_string_length);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_78,local_70);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," now has ",9);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pCVar9->pNumberOfTroops);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," armies",7);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  if (local_78 != local_68) {
                    operator_delete(local_78,local_68[0] + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Country ",8);
                  pcVar6 = (local_80->cyName->_M_dataplus)._M_p;
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_78,pcVar6,pcVar6 + local_80->cyName->_M_string_length)
                  ;
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_78,local_70);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," had ",5);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," armies",7);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  if (local_78 != local_68) {
                    operator_delete(local_78,local_68[0] + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Country ",8);
                  pcVar6 = (local_80->cyName->_M_dataplus)._M_p;
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_78,pcVar6,pcVar6 + local_80->cyName->_M_string_length)
                  ;
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_78,local_70);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," now has ",9);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,*local_80->pNumberOfTroops);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10," armies",7);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  if (local_78 != local_68) {
                    operator_delete(local_78,local_68[0] + 1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\x1b[31m",5);
                  iVar7 = local_54;
                  goto LAB_00109d85;
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

bool test_Player_fortify(bool verbose = false) {

    bool success = true;
    GameLoop::start();
    GameLoop::getInstance()->distributeArmies(); // because you need armies to fortify

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();
    auto* neighbour = new Map::Country(99, "neighbour", 1);
    neighbour->setPlayerOwnerID(GameLoop::getInstance()->getAllPlayers()->at(0)->getPlayerId());
    int numArmiesC2 = neighbour->getNumberOfTroops();

    GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getAdjCountries()->push_back(neighbour);

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->fortify() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        Map::Country* c1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0);
        std::cout << "\033[35m";
        std::cout << "Country " << c1->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
        std::cout << "Country " << c1->getCountryName() << " now has " << c1->getNumberOfTroops() << " armies"
                  << std::endl;
        std::cout << "Country " << neighbour->getCountryName() << " had " << numArmiesC2 <<" armies" << std::endl;
        std::cout << "Country " << neighbour->getCountryName() << " now has " << neighbour->getNumberOfTroops() << " armies"
                  << std::endl;
        std::cout << "\033[31m";
    }
    GameLoop::resetInstance();
    return success;
}